

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O0

model_t * __thiscall cfgfile::generator::cfg::model_t::operator=(model_t *this,model_t *other)

{
  string *psVar1;
  model_t *in_RSI;
  model_t *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000088;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000090;
  
  if (in_RDI != in_RSI) {
    root_namespace(in_RSI);
    namespace_t::operator=(&in_RSI->m_root,&in_RDI->m_root);
    global_includes_abi_cxx11_(in_RSI);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(in_stack_00000090,in_stack_00000088);
    relative_includes_abi_cxx11_(in_RSI);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(in_stack_00000090,in_stack_00000088);
    psVar1 = include_guard_abi_cxx11_(in_RSI);
    std::__cxx11::string::operator=((string *)&in_RDI->m_include_guard,(string *)psVar1);
  }
  return in_RDI;
}

Assistant:

model_t &
model_t::operator = ( const model_t & other )
{
	if( this != &other )
	{
		m_root = other.root_namespace();
		m_global_includes = other.global_includes();
		m_relative_includes = other.relative_includes();
		m_include_guard = other.include_guard();
	}

	return *this;
}